

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgentBG.cpp
# Opt level: O0

Index __thiscall AgentBG::Act(AgentBG *this,Index oI,Index prevJoI)

{
  _func_int **pp_Var1;
  int iVar2;
  uint uVar3;
  reference pvVar4;
  JointBeliefInterface *pJVar5;
  PlanningUnitDecPOMDPDiscrete *pPVar6;
  DecPOMDPDiscreteInterface *pDVar7;
  undefined4 in_EDX;
  uint in_ESI;
  AgentDecPOMDPDiscrete *in_RDI;
  JointBeliefInterface *jbi_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> aIs;
  Index ja;
  JointBeliefInterface *jbi;
  Index aI;
  BGPolicyIndex betaMaxI;
  Index in_stack_00000128;
  Index in_stack_0000012c;
  MultiAgentDecisionProcessDiscreteInterface *in_stack_00000130;
  JointBeliefSparse *in_stack_00000138;
  LIndex in_stack_ffffffffffffff48;
  AgentDecPOMDPDiscrete *i;
  JointPolicyPureVector *in_stack_ffffffffffffff50;
  Index joI;
  JointPolicyPureVector *this_00;
  PlanningUnitMADPDiscrete *in_stack_ffffffffffffff58;
  PlanningUnitMADPDiscrete *in_stack_ffffffffffffff60;
  JointBeliefInterface *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  Index local_2c;
  JointBeliefInterface *local_28;
  Index local_1c;
  BGPolicyIndex local_18;
  undefined4 local_10;
  uint local_c;
  
  local_18 = 0x7fffffff;
  local_1c = 0x7fffffff;
  local_10 = in_EDX;
  local_c = in_ESI;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff60,
             (value_type_conflict1 *)in_stack_ffffffffffffff58);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff60,
             (value_type_conflict1 *)in_stack_ffffffffffffff58);
  pPVar6 = in_RDI[1]._m_pu;
  if (pPVar6 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    AgentDecPOMDPDiscrete::GetPU(in_RDI);
    joI = (Index)((ulong)in_stack_ffffffffffffff50 >> 0x20);
    local_28 = PlanningUnitMADPDiscrete::GetNewJointBeliefFromISD(in_stack_ffffffffffffff60);
    local_2c = GetMaximizingActionIndex
                         ((AgentBG *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          in_stack_ffffffffffffff78);
    if (local_28 != (JointBeliefInterface *)0x0) {
      (**(code **)((long)*local_28 + 8))();
    }
    AgentDecPOMDPDiscrete::GetPU(in_RDI);
    PlanningUnitMADPDiscrete::JointToIndividualActionIndices(in_stack_ffffffffffffff58,joI);
    uVar3 = (*(in_RDI->super_SimulationAgent)._vptr_SimulationAgent[2])();
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&local_48,(ulong)uVar3);
    local_1c = *pvVar4;
    in_RDI[10].super_SimulationAgent._m_id = local_2c;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff60);
  }
  else if (pPVar6 == (PlanningUnitDecPOMDPDiscrete *)0x1) {
    AgentDecPOMDPDiscrete::GetPU(in_RDI);
    pJVar5 = PlanningUnitMADPDiscrete::GetNewJointBeliefFromISD(in_stack_ffffffffffffff60);
    local_18 = GetMaximizingBGIndex
                         ((AgentBG *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          in_stack_ffffffffffffff78);
    if (pJVar5 != (JointBeliefInterface *)0x0) {
      (**(code **)((long)*pJVar5 + 8))();
    }
    JointPolicyPureVector::SetIndex(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    (**(code **)(*in_RDI[6].super_SimulationAgent._vptr_SimulationAgent + 0x38))();
    pp_Var1 = in_RDI[6].super_SimulationAgent._vptr_SimulationAgent;
    iVar2 = (*(in_RDI->super_SimulationAgent)._vptr_SimulationAgent[2])();
    local_1c = (**(code **)(*pp_Var1 + 0x98))(pp_Var1,iVar2,local_c);
  }
  else if (pPVar6 == (PlanningUnitDecPOMDPDiscrete *)0x2) {
    in_stack_ffffffffffffff60 = (PlanningUnitMADPDiscrete *)(in_RDI + 2);
    pPVar6 = AgentDecPOMDPDiscrete::GetPU(in_RDI);
    PlanningUnitDecPOMDPDiscrete::GetDPOMDPD(pPVar6);
    JointBeliefSparse::Update
              (in_stack_00000138,in_stack_00000130,in_stack_0000012c,in_stack_00000128);
    local_18 = GetMaximizingBGIndex
                         ((AgentBG *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          in_stack_ffffffffffffff78);
    JointPolicyPureVector::SetIndex(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    (**(code **)(*in_RDI[6].super_SimulationAgent._vptr_SimulationAgent + 0x38))();
    pp_Var1 = in_RDI[6].super_SimulationAgent._vptr_SimulationAgent;
    iVar2 = (*(in_RDI->super_SimulationAgent)._vptr_SimulationAgent[2])();
    local_1c = (**(code **)(*pp_Var1 + 0x98))(pp_Var1,iVar2,local_c);
  }
  else {
    i = in_RDI + 2;
    pPVar6 = AgentDecPOMDPDiscrete::GetPU(in_RDI);
    pDVar7 = PlanningUnitDecPOMDPDiscrete::GetDPOMDPD(pPVar6);
    this_00 = (JointPolicyPureVector *)(&pDVar7->field_0x0 + *(long *)(*(long *)pDVar7 + -0xb8));
    pp_Var1 = in_RDI[6].super_SimulationAgent._vptr_SimulationAgent;
    (**(code **)(*pp_Var1 + 0x88))(pp_Var1,local_10);
    JointBeliefSparse::Update
              (in_stack_00000138,in_stack_00000130,in_stack_0000012c,in_stack_00000128);
    local_18 = GetMaximizingBGIndex
                         ((AgentBG *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          in_stack_ffffffffffffff78);
    JointPolicyPureVector::SetIndex(this_00,(LIndex)i);
    (**(code **)(*in_RDI[6].super_SimulationAgent._vptr_SimulationAgent + 0x38))();
    in_stack_ffffffffffffff58 =
         (PlanningUnitMADPDiscrete *)in_RDI[6].super_SimulationAgent._vptr_SimulationAgent;
    uVar3 = (*(in_RDI->super_SimulationAgent)._vptr_SimulationAgent[2])();
    local_1c = (*(in_stack_ffffffffffffff58->super_PlanningUnit)._vptr_PlanningUnit[0x13])
                         (in_stack_ffffffffffffff58,(ulong)uVar3,(ulong)local_c);
  }
  in_RDI[1]._m_pu =
       (PlanningUnitDecPOMDPDiscrete *)
       ((long)&((in_RDI[1]._m_pu)->super_PlanningUnitMADPDiscrete).super_PlanningUnit.
               _vptr_PlanningUnit + 1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff60,
             (value_type_conflict1 *)in_stack_ffffffffffffff58);
  return local_1c;
}

Assistant:

Index AgentBG::Act(Index oI, Index prevJoI)
{
    AlphaVector::BGPolicyIndex betaMaxI=INT_MAX;
    Index aI=INT_MAX;

    _m_oIs.push_back(oI);
    _m_prevJoIs.push_back(prevJoI);

#if DEBUG_AgentBG
//     cout << " oIs "; PrintVectorCout(_m_oIs);
//     cout << " prevJoIs "; PrintVectorCout(_m_prevJoIs);
#endif

    switch(_m_t)
    {
    case 0: // we know joint belief at t=0, namely the ISD, so we can
            // use the POMDP action
    {
        JointBeliefInterface* jbi = GetPU()->GetNewJointBeliefFromISD();
        Index ja=GetMaximizingActionIndex(*jbi);
        delete jbi;
        vector<Index> aIs=GetPU()->JointToIndividualActionIndices(ja);
        aI=aIs[GetIndex()];
        _m_jaIfirst=ja;
#if DEBUG_AgentBG
        cout << GetIndex() << ": ja " << ja << " aI " << aI << endl;
#endif
        break;
    }
    case 1: // at t=1, the previous joint belief is the ISD, but now
            // we use the BG policy
    {
        JointBeliefInterface* jbi = GetPU()->GetNewJointBeliefFromISD();
        betaMaxI=GetMaximizingBGIndex(*jbi);
        delete jbi;

        _m_jpol->SetIndex(betaMaxI);
        _m_jpol->Print();
        aI=_m_jpol->GetActionIndex(GetIndex(),oI);
        break;
    }
    case 2: // now we start updating the previous joint beliefs, using
            // the joint action we took at t=0
    {
        _m_prevJB.Update(*GetPU()->GetDPOMDPD(),_m_jaIfirst,prevJoI);

        betaMaxI=GetMaximizingBGIndex(_m_prevJB);

        _m_jpol->SetIndex(betaMaxI);
        _m_jpol->Print();
        aI=_m_jpol->GetActionIndex(GetIndex(),oI);
        break;
    }
    default: // the rest of the time we use the previous BG jpol to
             // get the joint action to update the joint belief
    {
        _m_prevJB.Update(*GetPU()->GetDPOMDPD(),_m_jpol->GetJointActionIndex(prevJoI),
                         prevJoI);

        betaMaxI=GetMaximizingBGIndex(_m_prevJB);

        _m_jpol->SetIndex(betaMaxI);
        _m_jpol->Print();
        aI=_m_jpol->GetActionIndex(GetIndex(),oI);
        break;
    }
    }

    _m_t++;

    _m_aIs.push_back(aI);

#if DEBUG_AgentBG
//     cout << GetIndex() << ": t " << _m_t << " oI " << oI
//          << " prevJoI " << prevJoI << endl;

//     cout << GetIndex() << ":";
//     cout << " prevJaIs "; PrintVectorCout(_m_prevJaIs);
//     cout << " aIs "; PrintVectorCout(_m_aIs);
//     cout << endl;

#endif

    return(aI);
}